

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pbrt_test.cpp
# Opt level: O1

void usage(string *msg)

{
  if (msg->_M_string_length != 0) {
    fprintf(_stderr,"pbrt_test: %s\n\n",(msg->_M_dataplus)._M_p);
  }
  fwrite("pbrt_test arguments:\n  --list-tests                List all tests.\n  --log-level <level>         Log messages at or above this level, where <level>\n                              is \"verbose\", \"error\", or \"fatal\". Default: \"error\".\n  --nthreads <num>            Use specified number of threads for rendering.\n  --test-filter <regexp>      Regular expression of test names to run.\n  --vlog-level <n>            Set VLOG verbosity. (Default: 0, disabled.)\n"
         ,0x1c5,1,_stderr);
  exit((uint)(msg->_M_string_length != 0));
}

Assistant:

void usage(const std::string &msg = "") {
    if (!msg.empty())
        fprintf(stderr, "pbrt_test: %s\n\n", msg.c_str());

    fprintf(stderr, R"(pbrt_test arguments:
  --list-tests                List all tests.
  --log-level <level>         Log messages at or above this level, where <level>
                              is "verbose", "error", or "fatal". Default: "error".
  --nthreads <num>            Use specified number of threads for rendering.
  --test-filter <regexp>      Regular expression of test names to run.
  --vlog-level <n>            Set VLOG verbosity. (Default: 0, disabled.)
)");

    exit(msg.empty() ? 0 : 1);
}